

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O2

CURLcode curlx_dyn_vaddf(dynbuf *s,char *fmt,__va_list_tag *ap)

{
  CURLcode CVar1;
  uchar *mem;
  size_t len;
  
  mem = (uchar *)curl_mvaprintf(fmt,ap);
  if (mem == (uchar *)0x0) {
    curlx_dyn_free(s);
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    len = strlen((char *)mem);
    CVar1 = dyn_nappend(s,mem,len);
    free(mem);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_dyn_vaddf(struct dynbuf *s, const char *fmt, va_list ap)
{
#ifdef BUILDING_LIBCURL
  int rc;
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  DEBUGASSERT(fmt);
  rc = Curl_dyn_vprintf(s, fmt, ap);

  if(!rc)
    return CURLE_OK;
  else if(rc == MERR_TOO_LARGE)
    return CURLE_TOO_LARGE;
  return CURLE_OUT_OF_MEMORY;
#else
  char *str;
  str = vaprintf(fmt, ap); /* this allocs a new string to append */

  if(str) {
    CURLcode result = dyn_nappend(s, (const unsigned char *)str, strlen(str));
    free(str);
    return result;
  }
  /* If we failed, we cleanup the whole buffer and return error */
  Curl_dyn_free(s);
  return CURLE_OUT_OF_MEMORY;
#endif
}